

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O3

void __thiscall
sigslot::
signal1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
::operator()(signal1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a1)

{
  connections_list *pcVar1;
  _List_node_base *p_Var2;
  pointer pcVar3;
  _List_node_base *p_Var4;
  long *local_50 [2];
  long local_40 [2];
  
  (*(this->
    super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
    ).super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
    _vptr_multi_threaded_local[2])();
  pcVar1 = &(this->
            super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
            ).m_connected_slots;
  p_Var4 = (this->
           super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
           ).m_connected_slots.
           super__List_base<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)pcVar1) {
    do {
      p_Var2 = p_Var4[1]._M_next;
      p_Var4 = p_Var4->_M_next;
      pcVar3 = (a1->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar3,pcVar3 + a1->_M_string_length);
      (**(code **)((long)p_Var2->_M_next + 0x18))(p_Var2,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    } while (p_Var4 != (_List_node_base *)pcVar1);
  }
  (*(this->
    super__signal_base1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
    ).super__signal_base<sigslot::multi_threaded_local>.super_multi_threaded_local.
    _vptr_multi_threaded_local[3])();
  return;
}

Assistant:

void operator()(arg1_type a1)
		{
			lock_block<mt_policy> lock(this);
			const_iterator itNext, it = this->m_connected_slots.begin();
			const_iterator itEnd = this->m_connected_slots.end();

			while(it != itEnd)
			{
				itNext = it;
				++itNext;

				(*it)->emit(a1);

				it = itNext;
			}
		}